

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

string * __thiscall wasm::Type::toString_abi_cxx11_(string *__return_storage_ptr__,Type *this)

{
  ostringstream local_198 [8];
  ostringstream ss;
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  wasm::operator<<((ostream *)local_198,(Type)this->id);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Type::toString() const { return genericToString(*this); }